

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Waitsome(int incount,MPIABI_Request *array_of_requests,int *outcount,
                   int *array_of_indices,MPIABI_Status *array_of_statuses)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  long lVar8;
  int *piVar9;
  anon_union_24_2_44bf1552_for_mpi_status *paVar10;
  anon_union_24_2_44bf1552_for_mpi_status *paVar11;
  ulong uVar12;
  ulong uVar13;
  undefined8 *puVar14;
  
  uVar12 = (ulong)(uint)incount;
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    lVar8 = 0;
    uVar13 = 0;
    if (0 < incount) {
      uVar13 = uVar12;
    }
    puVar14 = (undefined8 *)((long)&array_of_statuses->mpi_status + 0xc);
    for (; uVar13 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
      uVar1 = *(undefined4 *)((long)&array_of_statuses->mpi_status + lVar8 + 0x14);
      uVar4 = *(undefined8 *)((long)&array_of_statuses->mpi_status + lVar8 + 0xc);
      uVar2 = *(undefined4 *)((long)&array_of_statuses->MPI_ERROR + lVar8);
      *(undefined8 *)((long)puVar14 + -0xc) =
           *(undefined8 *)((long)&array_of_statuses->MPI_SOURCE + lVar8);
      *(undefined4 *)((long)puVar14 + -4) = uVar2;
      *puVar14 = uVar4;
      *(undefined4 *)(puVar14 + 1) = uVar1;
      puVar14 = puVar14 + 3;
    }
  }
  iVar7 = MPI_Waitsome(uVar12);
  if (array_of_statuses != (MPIABI_Status *)0x0) {
    piVar9 = &array_of_statuses[uVar12 - 1].MPI_ERROR;
    paVar11 = &array_of_statuses->mpi_status + uVar12;
    while( true ) {
      paVar10 = paVar11 + -1;
      if ((int)uVar12 < 1) break;
      iVar3 = *(int *)((long)paVar11 + -0x10);
      uVar4 = *(undefined8 *)paVar10;
      uVar5 = *(undefined8 *)paVar10;
      uVar6 = *(undefined8 *)((long)paVar11 + -0x10);
      *(undefined8 *)(piVar9 + -4) = *(undefined8 *)((long)paVar11 + -8);
      *(undefined8 *)&((MPIABI_Status *)(piVar9 + -8))->mpi_status = uVar5;
      *(undefined8 *)(piVar9 + -6) = uVar6;
      *(undefined8 *)(piVar9 + -2) = uVar4;
      *piVar9 = iVar3;
      uVar12 = (ulong)((int)uVar12 - 1);
      piVar9 = piVar9 + -10;
      paVar11 = paVar10;
    }
  }
  return iVar7;
}

Assistant:

int MPIABI_Waitsome(int incount, MPIABI_Request array_of_requests[],
                               int *outcount, int array_of_indices[],
                               MPIABI_Status array_of_statuses[]) {
  const bool ignore_statuses =
      (MPI_Status *)array_of_statuses == MPI_STATUSES_IGNORE;
  MPI_Request *const reqs = (MPI_Request *)(void *)array_of_requests;
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = 0; i < incount; ++i)
      reqs[i] = (WPI_Request)array_of_requests[i];
  MPI_Status *const stats = (MPI_Status *)(void *)array_of_statuses;
  if (!ignore_statuses)
    for (int i = 0; i < incount; ++i)
      stats[i] = (WPI_Status)array_of_statuses[i];
  const int ierr =
      MPI_Waitsome(incount, reqs, outcount, array_of_indices, stats);
  if (sizeof(MPI_Request) != sizeof(MPIABI_Request))
    for (int i = incount - 1; i >= 0; --i)
      array_of_requests[i] = (WPI_Request)reqs[i];
  if (!ignore_statuses)
    for (int i = incount - 1; i >= 0; --i)
      array_of_statuses[i] = (WPI_Status)stats[i];
  return ierr;
}